

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbUtil.c
# Opt level: O1

Vec_Int_t * Acb_NtkPlaces(char *pFileName,Vec_Ptr_t *vNames)

{
  char *pcVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  char *__s;
  size_t sVar5;
  Vec_Int_t *p;
  int *piVar6;
  size_t sVar7;
  int iVar8;
  char *pcVar9;
  long lVar10;
  
  __s = Extra_FileReadContents(pFileName);
  sVar5 = strlen(__s);
  if (__s == (char *)0x0) {
    return (Vec_Int_t *)0x0;
  }
  iVar8 = vNames->nSize;
  p = (Vec_Int_t *)malloc(0x10);
  iVar4 = 0x10;
  if (0xe < iVar8 - 1U) {
    iVar4 = iVar8;
  }
  p->nSize = 0;
  p->nCap = iVar4;
  if (iVar4 == 0) {
    piVar6 = (int *)0x0;
  }
  else {
    piVar6 = (int *)malloc((long)iVar4 << 2);
  }
  p->pArray = piVar6;
  bVar3 = true;
  iVar8 = -1;
  pcVar9 = __s;
  do {
    cVar2 = *pcVar9;
    if (cVar2 == '\n') {
      iVar8 = ((int)pcVar9 - (int)__s) + 1;
    }
    else if (cVar2 == '(') {
      if (bVar3) {
        bVar3 = false;
      }
      else {
        pcVar9 = strtok(pcVar9 + 1,"  \n\r\t");
        if (0 < vNames->nSize) {
          lVar10 = 0;
          do {
            iVar4 = strcmp((char *)vNames->pArray[lVar10],pcVar9);
            if (iVar4 == 0) {
              Vec_IntPush(p,iVar8);
              Vec_IntPush(p,(int)lVar10);
            }
            lVar10 = lVar10 + 1;
          } while (lVar10 < vNames->nSize);
        }
        sVar7 = strlen(pcVar9);
        pcVar9 = pcVar9 + (sVar7 - 1);
        do {
          pcVar1 = pcVar9 + 1;
          pcVar9 = pcVar9 + 1;
        } while (*pcVar1 == '\0');
        bVar3 = false;
        if (__s + sVar5 <= pcVar9) {
          __assert_fail("pTemp < pLimit",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                        ,0x2b9,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
        }
      }
    }
    else if (cVar2 == '\0') {
      if (p->nSize == vNames->nSize * 2) {
        free(__s);
        return p;
      }
      __assert_fail("Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbUtil.c"
                    ,0x2bd,"Vec_Int_t *Acb_NtkPlaces(char *, Vec_Ptr_t *)");
    }
    pcVar9 = pcVar9 + 1;
  } while( true );
}

Assistant:

Vec_Int_t * Acb_NtkPlaces( char * pFileName, Vec_Ptr_t * vNames )
{
    Vec_Int_t * vPlaces; int First = 1, Pos = -1;
    char * pTemp, * pBuffer = Extra_FileReadContents( pFileName );
    char * pLimit = pBuffer + strlen(pBuffer);
    if ( pBuffer == NULL )
        return NULL;
    vPlaces = Vec_IntAlloc( Vec_PtrSize(vNames) );
    for ( pTemp = pBuffer; *pTemp; pTemp++ )
    {
        if ( *pTemp == '\n' )
            Pos = pTemp - pBuffer + 1;
        else if ( *pTemp == '(' )
        {
            if ( First )
                First = 0;
            else
            {
                char * pToken = strtok( pTemp+1, "  \n\r\t" );
                char * pName; int i;
                Vec_PtrForEachEntry( char *, vNames, pName, i )
                    if ( !strcmp(pName, pToken) )
                        Vec_IntPushTwo( vPlaces, Pos, i );
                pTemp = pToken + strlen(pToken);
                while ( *pTemp == 0 )
                    pTemp++;
                assert( pTemp < pLimit );
            }
        }
    }
    assert( Vec_IntSize(vPlaces) == 2*Vec_PtrSize(vNames) );
    ABC_FREE( pBuffer );
    return vPlaces;
}